

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_think.cpp
# Opt level: O1

void __thiscall DBot::WhatToGet(DBot *this,AActor *item)

{
  APlayerPawn *this_00;
  PClass *pPVar1;
  int iVar2;
  undefined8 in_RAX;
  AActor *pAVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  AInventory *p;
  AWeapon *pAVar4;
  undefined4 extraout_var_01;
  PClassActor *type;
  AAmmo *pAVar5;
  PClass *pPVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  PClass *pPVar7;
  PClass *pPVar8;
  AAmmo *ammo;
  bool bVar9;
  bool bVar10;
  FName local_28;
  FName local_24;
  
  local_24.Index = (int)((ulong)in_RAX >> 0x20);
  if (((item->renderflags).Value & 0x8000) != 0) {
    return;
  }
  pAVar3 = (this->prev).field_0.p;
  if ((pAVar3 != (AActor *)0x0) &&
     (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (this->prev).field_0.p = (AActor *)0x0;
    pAVar3 = (AActor *)0x0;
  }
  pPVar6 = AWeapon::RegistrationInfo.MyClass;
  if (pAVar3 == item) {
    return;
  }
  if ((alwaysapplydmflags.Value == false) && (deathmatch.Value == 0)) {
    bVar10 = false;
  }
  else {
    bVar10 = ((byte)dmflags.Value & 4) == 0;
  }
  if ((item->super_DThinker).super_DObject.Class == (PClass *)0x0) {
    iVar2 = (**(item->super_DThinker).super_DObject._vptr_DObject)(item);
    (item->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
  }
  pPVar1 = AAmmo::RegistrationInfo.MyClass;
  pPVar7 = (item->super_DThinker).super_DObject.Class;
  bVar9 = pPVar7 != (PClass *)0x0;
  pPVar8 = pPVar7;
  if (pPVar7 != pPVar6 && bVar9) {
    do {
      pPVar8 = pPVar8->ParentClass;
      bVar9 = pPVar8 != (PClass *)0x0;
      if (pPVar8 == pPVar6) break;
    } while (pPVar8 != (PClass *)0x0);
  }
  if (bVar9) {
    this_00 = this->player->mo;
    if (pPVar7 == (PClass *)0x0) {
      iVar2 = (**(item->super_DThinker).super_DObject._vptr_DObject)(item);
      (item->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar2);
    }
    p = AActor::FindInventory
                  (&this_00->super_AActor,(PClassActor *)(item->super_DThinker).super_DObject.Class,
                   false);
    pAVar4 = dyn_cast<AWeapon>((DObject *)p);
    if (pAVar4 == (AWeapon *)0x0) goto LAB_004723ff;
    if (!bVar10) {
      return;
    }
    pAVar5 = (pAVar4->Ammo1).field_0.p;
    if (pAVar5 != (AAmmo *)0x0) {
      if (((pAVar5->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags & 0x20)
          == 0) {
        pAVar5 = (pAVar4->Ammo1).field_0.p;
        if ((pAVar5->super_AInventory).Amount < (pAVar5->super_AInventory).MaxAmount)
        goto LAB_004723ff;
      }
      else {
        (pAVar4->Ammo1).field_0.p = (AAmmo *)0x0;
      }
    }
    pAVar5 = (pAVar4->Ammo2).field_0.p;
    if (pAVar5 == (AAmmo *)0x0) {
      return;
    }
    if (((pAVar5->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags & 0x20) !=
        0) {
      (pAVar4->Ammo2).field_0.p = (AAmmo *)0x0;
      return;
    }
    pAVar5 = (pAVar4->Ammo2).field_0.p;
  }
  else {
    if (pPVar7 == (PClass *)0x0) {
      iVar2 = (**(item->super_DThinker).super_DObject._vptr_DObject)(item);
      (item->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_01,iVar2);
    }
    pPVar6 = (item->super_DThinker).super_DObject.Class;
    bVar10 = pPVar6 != (PClass *)0x0;
    if (pPVar6 != pPVar1 && bVar10) {
      do {
        pPVar6 = pPVar6->ParentClass;
        bVar10 = pPVar6 != (PClass *)0x0;
        if (pPVar6 == pPVar1) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    if (!bVar10) {
      iVar2 = FName::NameManager::FindName(&FName::NameData,"Megasphere",true);
      _local_28 = CONCAT44(local_24.Index,iVar2);
      pPVar6 = PClass::FindClass(&local_28);
      if ((item->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar2 = (**(item->super_DThinker).super_DObject._vptr_DObject)(item);
        (item->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_02,iVar2);
      }
      pPVar7 = (item->super_DThinker).super_DObject.Class;
      bVar10 = pPVar7 != (PClass *)0x0;
      if (pPVar7 != pPVar6 && bVar10) {
        do {
          pPVar7 = pPVar7->ParentClass;
          bVar10 = pPVar7 != (PClass *)0x0;
          if (pPVar7 == pPVar6) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if (bVar10) {
LAB_00472344:
        if (deh.MaxSoulsphere <= (this->player->mo->super_AActor).health) {
          return;
        }
      }
      else {
        iVar2 = FName::NameManager::FindName(&FName::NameData,"Soulsphere",true);
        _local_28 = CONCAT44(iVar2,local_28.Index);
        pPVar6 = PClass::FindClass(&local_24);
        if ((item->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(item->super_DThinker).super_DObject._vptr_DObject)(item);
          (item->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_03,iVar2);
        }
        pPVar7 = (item->super_DThinker).super_DObject.Class;
        bVar10 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar6 && bVar10) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar10 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar6) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (bVar10) goto LAB_00472344;
        pPVar6 = PClass::FindClass("HealthBonus");
        bVar10 = DObject::IsKindOf((DObject *)item,pPVar6);
        if (bVar10) goto LAB_00472344;
      }
      pPVar6 = AHealth::RegistrationInfo.MyClass;
      if ((item->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar2 = (**(item->super_DThinker).super_DObject._vptr_DObject)(item);
        (item->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_04,iVar2);
      }
      pPVar7 = (item->super_DThinker).super_DObject.Class;
      bVar10 = pPVar7 != (PClass *)0x0;
      if (pPVar7 != pPVar6 && bVar10) {
        do {
          pPVar7 = pPVar7->ParentClass;
          bVar10 = pPVar7 != (PClass *)0x0;
          if (pPVar7 == pPVar6) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if ((bVar10) && (deh.MaxHealth <= (this->player->mo->super_AActor).health)) {
        return;
      }
      goto LAB_004723ff;
    }
    type = AAmmo::GetParentAmmo((AAmmo *)item);
    pAVar5 = (AAmmo *)AActor::FindInventory(&this->player->mo->super_AActor,type,false);
    if (pAVar5 == (AAmmo *)0x0) goto LAB_004723ff;
  }
  if ((pAVar5->super_AInventory).MaxAmount <= (pAVar5->super_AInventory).Amount) {
    return;
  }
LAB_004723ff:
  pAVar3 = (this->dest).field_0.p;
  if (pAVar3 != (AActor *)0x0) {
    if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if (((((this->dest).field_0.p)->flags).Value & 1) != 0) {
        return;
      }
    }
    else {
      (this->dest).field_0.p = (AActor *)0x0;
    }
  }
  (this->prev).field_0 = (this->dest).field_0;
  (this->dest).field_0.p = item;
  this->t_roam = 0x8c;
  return;
}

Assistant:

void DBot::WhatToGet (AActor *item)
{
#define typeis(x) item->IsKindOf (PClass::FindClass (#x))
	if ((item->renderflags & RF_INVISIBLE) //Under respawn and away.
		|| item == prev)
	{
		return;
	}
	int weapgiveammo = (alwaysapplydmflags || deathmatch) && !(dmflags & DF_WEAPONS_STAY);

	//if(pos && !bglobal.thingvis[pos->id][item->id]) continue;
//	if (item->IsKindOf (RUNTIME_CLASS(AArtifact)))
//		return;	// don't know how to use artifacts
	if (item->IsKindOf (RUNTIME_CLASS(AWeapon)))
	{
		// FIXME
		AWeapon *heldWeapon;

		heldWeapon = dyn_cast<AWeapon>(player->mo->FindInventory(item->GetClass()));
		if (heldWeapon != NULL)
		{
			if (!weapgiveammo)
				return;
			if ((heldWeapon->Ammo1 == NULL || heldWeapon->Ammo1->Amount >= heldWeapon->Ammo1->MaxAmount) &&
				(heldWeapon->Ammo2 == NULL || heldWeapon->Ammo2->Amount >= heldWeapon->Ammo2->MaxAmount))
			{
				return;
			}
		}
	}
	else if (item->IsKindOf (RUNTIME_CLASS(AAmmo)))
	{
		AAmmo *ammo = static_cast<AAmmo *> (item);
		PClassActor *parent = ammo->GetParentAmmo ();
		AInventory *holdingammo = player->mo->FindInventory (parent);

		if (holdingammo != NULL && holdingammo->Amount >= holdingammo->MaxAmount)
		{
			return;
		}
	}
	else if ((typeis (Megasphere) || typeis (Soulsphere) || typeis (HealthBonus)) && player->mo->health >= deh.MaxSoulsphere)
		return;
	else if (item->IsKindOf (RUNTIME_CLASS(AHealth)) && player->mo->health >= deh.MaxHealth /*MAXHEALTH*/)
		return;

	if ((dest == NULL ||
		!(dest->flags & MF_SPECIAL)/* ||
		!Reachable (dest)*/)/* &&
		Reachable (item)*/)	// Calling Reachable slows this down tremendously
	{
		prev = dest;
		dest = item;
		t_roam = MAXROAM;
	}
}